

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O3

void list_split_anything(t_list_split *x,t_symbol *s,int argc,t_atom *argv)

{
  uint argc_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  t_atom *argv_00;
  ulong uVar5;
  t_atom *argv_01;
  t_symbol *ptVar6;
  undefined8 uStack_38;
  
  argv_01 = (t_atom *)&uStack_38;
  argc_00 = argc + 1;
  ptVar6 = s;
  if (argc < 99) {
    lVar4 = (long)(int)argc_00;
    argv_01 = (t_atom *)(&uStack_38 + lVar4 * -2);
    *(undefined4 *)(&uStack_38 + lVar4 * -2) = 2;
    *(t_symbol **)(&stack0xffffffffffffffd0 + lVar4 * -0x10) = s;
    argv_00 = argv_01;
    if (argc < 1) {
      (&uStack_38)[lVar4 * -2 + -1] = 0x184710;
      list_split_list(x,s,argc_00,argv_01);
      return;
    }
  }
  else {
    argv_00 = (t_atom *)getbytes((ulong)argc_00 << 4);
    argv_00->a_type = A_SYMBOL;
    (argv_00->a_w).w_symbol = s;
  }
  uVar5 = (ulong)(uint)argc;
  lVar4 = 0x10;
  do {
    puVar1 = (undefined8 *)((long)&argv[-1].a_type + lVar4);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&argv_00->a_type + lVar4);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    lVar4 = lVar4 + 0x10;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  argv_01[-1].a_w.w_symbol = (t_symbol *)0x184757;
  list_split_list(x,ptVar6,argc_00,argv_00);
  if (0x62 < argc) {
    argv_01[-1].a_w.w_symbol = (t_symbol *)0x18476b;
    freebytes(argv_00,(ulong)argc_00 << 4);
  }
  return;
}

Assistant:

static void list_split_anything(t_list_split *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_atom *outv;
    ATOMS_ALLOCA(outv, argc+1);
    SETSYMBOL(outv, s);
    atoms_copy(argc, argv, outv + 1);
    list_split_list(x, &s_list, argc+1, outv);
    ATOMS_FREEA(outv, argc+1);
}